

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_ToInt64(JSContext *ctx,int64_t *pres,JSValue val)

{
  JSValue v;
  int iVar1;
  int64_t in_RCX;
  JSValueUnion in_RDX;
  JSContext *in_RDI;
  int64_t *unaff_retaddr;
  JSContext *in_stack_00000008;
  JSValue in_stack_00000010;
  
  v.tag = in_RCX;
  v.u.float64 = in_RDX.float64;
  JS_DupValue(in_RDI,v);
  iVar1 = JS_ToInt64Free(in_stack_00000008,unaff_retaddr,in_stack_00000010);
  return iVar1;
}

Assistant:

int JS_ToInt64(JSContext *ctx, int64_t *pres, JSValueConst val)
{
    return JS_ToInt64Free(ctx, pres, JS_DupValue(ctx, val));
}